

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O3

void __thiscall uttt::IBoard::MirrorVertical(IBoard *this)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  long lVar6;
  
  this->macro = g_macro_mirrored_vertical[this->macro];
  lVar6 = 4;
  do {
    *(short *)((long)(this->micro)._M_elems + lVar6 + -4) =
         (short)g_mirrored_vertical[*(short *)((long)(this->micro)._M_elems + lVar6 + -4)];
    lVar6 = lVar6 + 2;
  } while (lVar6 != 0x16);
  sVar1 = (this->micro)._M_elems[0];
  sVar2 = (this->micro)._M_elems[5];
  sVar3 = (this->micro)._M_elems[3];
  sVar4 = (this->micro)._M_elems[8];
  sVar5 = (this->micro)._M_elems[6];
  (this->micro)._M_elems[0] = (this->micro)._M_elems[2];
  (this->micro)._M_elems[2] = sVar1;
  (this->micro)._M_elems[3] = sVar2;
  (this->micro)._M_elems[5] = sVar3;
  (this->micro)._M_elems[6] = sVar4;
  (this->micro)._M_elems[8] = sVar5;
  if ((long)this->next != -1) {
    this->next = "\x02\x01"[this->next];
  }
  return;
}

Assistant:

void
IBoard::MirrorVertical()
{
    macro = g_macro_mirrored_vertical[macro];
    for (auto &m : micro)
        m = g_mirrored_vertical[m];
    micro = {{micro[2], micro[1], micro[0], micro[5], micro[4], micro[3], micro[8], micro[7], micro[6]}};
    if (next != -1)
        next = g_next_mirrored_vertical[next];
}